

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O1

second_type
google::protobuf::
FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
          (hash_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
           *collection,first_type *key)

{
  __node_ptr p_Var1;
  second_type pEVar2;
  __hash_code __c;
  
  __c = (long)key->second + (long)key->first * 0xffff;
  pEVar2 = (second_type)0x0;
  p_Var1 = std::
           _Hashtable<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)collection,
                          __c % (collection->
                                super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                )._M_h._M_bucket_count,key,__c);
  if (p_Var1 != (__node_ptr)0x0) {
    pEVar2 = *(second_type *)
              ((long)&(p_Var1->
                      super__Hash_node_value<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>
                      ._M_storage._M_storage + 0x10);
  }
  return pEVar2;
}

Assistant:

typename Collection::value_type::second_type
FindPtrOrNull(const Collection& collection,
              const typename Collection::value_type::first_type& key) {
  typename Collection::const_iterator it = collection.find(key);
  if (it == collection.end()) {
    return typename Collection::value_type::second_type();
  }
  return it->second;
}